

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intDup.c
# Opt level: O1

Aig_Man_t * Inter_ManStartOneOutput(Aig_Man_t *p,int fAddFirstPo)

{
  char *pcVar1;
  void *pvVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  uint uVar11;
  Aig_Obj_t *p1;
  int iVar12;
  ulong uVar13;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intDup.c"
                  ,0x80,"Aig_Man_t *Inter_ManStartOneOutput(Aig_Man_t *, int)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar9 = p->vCis;
  iVar12 = 0;
  if (pVVar9->nSize < 1) {
    pAVar6 = (Aig_Obj_t *)0x0;
  }
  else {
    uVar13 = 0;
    pAVar6 = (Aig_Obj_t *)0x0;
    do {
      pvVar2 = pVVar9->pArray[uVar13];
      if (uVar13 == (uint)p->nTruePis) {
        pAVar6 = Aig_ObjCreateCi(p_00);
      }
      pAVar7 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      uVar13 = uVar13 + 1;
      pVVar9 = p->vCis;
    } while ((long)uVar13 < (long)pVVar9->nSize);
  }
  lVar8 = 0x88;
  if (fAddFirstPo == 0) {
    iVar12 = p->nRegs;
    lVar8 = 0x6c;
  }
  p_00->nRegs = iVar12;
  p_00->nTruePis = *(int *)((long)p->nObjs + lVar8 + -0x80) + 1;
  p_00->nTruePos = p->nConstrs + fAddFirstPo;
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar8 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar8];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_00636880;
        uVar13 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        uVar13 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        pAVar7 = Aig_And(p_00,pAVar7,p1);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      }
      lVar8 = lVar8 + 1;
      pVVar9 = p->vObjs;
    } while (lVar8 < pVVar9->nSize);
  }
  uVar13 = (ulong)(uint)p->nTruePos;
  if (0 < p->nTruePos) {
    lVar8 = 0;
    do {
      if (p->vCos->nSize <= lVar8) goto LAB_00636861;
      if ((long)(int)uVar13 - (long)p->nConstrs <= lVar8) {
        pvVar2 = p->vCos->pArray[lVar8];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_00636880;
        uVar13 = *(ulong *)((long)pvVar2 + 8);
        uVar10 = uVar13 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar7 = (Aig_Obj_t *)0x1;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar13 & 1) ^ *(ulong *)(uVar10 + 0x28) ^ 1);
        }
        Aig_ObjCreateCo(p_00,pAVar7);
      }
      lVar8 = lVar8 + 1;
      uVar13 = (ulong)p->nTruePos;
    } while (lVar8 < (long)uVar13);
  }
  if (fAddFirstPo == 0) {
    if (0 < p->nRegs) {
      iVar12 = 0;
      do {
        uVar11 = p->nTruePos + iVar12;
        if (((((int)uVar11 < 0) || (p->vCos->nSize <= (int)uVar11)) ||
            (uVar3 = p->nTruePis + iVar12, (int)uVar3 < 0)) || (p->vCis->nSize <= (int)uVar3))
        goto LAB_00636861;
        pvVar2 = p->vCos->pArray[uVar11];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_00636880;
        uVar13 = *(ulong *)((long)pvVar2 + 8);
        uVar10 = uVar13 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar13 & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        pAVar7 = Aig_Mux(p_00,pAVar6,*(Aig_Obj_t **)((long)p->vCis->pArray[uVar3] + 0x28),pAVar7);
        Aig_ObjCreateCo(p_00,pAVar7);
        iVar12 = iVar12 + 1;
      } while (iVar12 < p->nRegs);
    }
  }
  else {
    if (p->vCos->nSize < 1) {
LAB_00636861:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar2 = *p->vCos->pArray;
    if (((ulong)pvVar2 & 1) != 0) {
LAB_00636880:
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
    }
    uVar13 = *(ulong *)((long)pvVar2 + 8);
    uVar10 = uVar13 & 0xfffffffffffffffe;
    if (uVar10 == 0) {
      pAVar6 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar13 & 1) ^ *(ulong *)(uVar10 + 0x28));
    }
    Aig_ObjCreateCo(p_00,pAVar6);
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Inter_ManStartOneOutput( Aig_Man_t * p, int fAddFirstPo )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    Aig_Obj_t * pCtrl = NULL; // Suppress "might be used uninitialized"
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( i == Saig_ManPiNum(p) )
            pCtrl = Aig_ObjCreateCi( pNew );
        pObj->pData = Aig_ObjCreateCi( pNew );
    }
    // set registers
    pNew->nRegs    = fAddFirstPo? 0 : p->nRegs;
    pNew->nTruePis = fAddFirstPo? Aig_ManCiNum(p) + 1 : p->nTruePis + 1;
    pNew->nTruePos = fAddFirstPo + Saig_ManConstrNum(p);
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

    // create constraint outputs
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            continue;
        Aig_ObjCreateCo( pNew, Aig_Not( Aig_ObjChild0Copy(pObj) ) );
    }

    // add the PO
    if ( fAddFirstPo )
    {
        pObj = Aig_ManCo( p, 0 );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    else
    {
        // create register inputs with MUXes
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        {
            pObj = Aig_Mux( pNew, pCtrl, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
    //        pObj = Aig_Mux( pNew, pCtrl, Aig_ManConst0(pNew), Aig_ObjChild0Copy(pObjLi) );
            Aig_ObjCreateCo( pNew, pObj );
        }
    }
    Aig_ManCleanup( pNew );
    return pNew;
}